

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierParser.cpp
# Opt level: O2

void __thiscall Refal2::CQualifierParser::addRightParen(CQualifierParser *this)

{
  bool bVar1;
  allocator local_31;
  string local_30;
  
  bVar1 = (this->builder).negative;
  if (bVar1 == true) {
    (this->builder).negative = false;
    this->afterRightParen = true;
  }
  else {
    if ((this->namedQualifier).type == TT_None) {
      if (this->afterRightParen == false) {
        (this->builder).negative = (bool)(bVar1 ^ 1);
      }
      CParsingElementState::SetCorrect(&this->super_CParsingElementState);
      return;
    }
    std::__cxx11::string::string
              ((string *)&local_30,"unexpected right parenthesis in named qualifier",&local_31);
    error(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void CQualifierParser::addRightParen()
{
	if( builder.IsNegative() ) {
		builder.AddNegative();
		afterRightParen = true;
	} else if( namedQualifier.IsNone() ) {
		if( !afterRightParen ) {
			builder.AddNegative();
		}
		SetCorrect();
	} else {
		error( "unexpected right parenthesis in named qualifier" );
	}
}